

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<std::pair<number,std::basic_string_view<char,std::char_traits<char>>>const*,std::pair<number,std::basic_string_view<char,std::char_traits<char>>>const*>
          (string *__return_storage_ptr__,Detail *this,
          pair<number,_std::basic_string_view<char,_std::char_traits<char>_>_> *first,
          pair<number,_std::basic_string_view<char,_std::char_traits<char>_>_> *last)

{
  pair<number,_std::basic_string_view<char,_std::char_traits<char>_>_> *ppVar1;
  ReusableStringStream rss;
  string local_68 [32];
  ReusableStringStream local_48;
  
  ReusableStringStream::ReusableStringStream(&local_48);
  std::operator<<(local_48.m_oss,"{ ");
  if ((pair<number,_std::basic_string_view<char,_std::char_traits<char>_>_> *)this != first) {
    std::__cxx11::string::string
              (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unprintableString_abi_cxx11_);
    std::operator<<(local_48.m_oss,local_68);
    std::__cxx11::string::~string(local_68);
    for (ppVar1 = (pair<number,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
                  (this + 0x18); ppVar1 != first; ppVar1 = ppVar1 + 1) {
      std::operator<<(local_48.m_oss,", ");
      std::__cxx11::string::string
                (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          unprintableString_abi_cxx11_);
      std::operator<<(local_48.m_oss,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  std::operator<<(local_48.m_oss," }");
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }